

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> * __thiscall
mxx::gatherv<std::tuple<int,int,int>>
          (vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
           *__return_storage_ptr__,mxx *this,tuple<int,_int,_int> *data,size_t size,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,comm *comm)

{
  int *piVar1;
  int iVar2;
  undefined4 in_register_0000008c;
  
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar2 = 0;
  for (piVar1 = *(int **)size; piVar1 != *(int **)(size + 8); piVar1 = piVar1 + 2) {
    iVar2 = iVar2 + *piVar1;
  }
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::resize
            (__return_storage_ptr__,(long)iVar2);
  gatherv<std::tuple<int,int,int>>
            ((tuple<int,_int,_int> *)this,(size_t)data,
             (__return_storage_ptr__->
             super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)size,(int)recv_sizes,
             (comm *)CONCAT44(in_register_0000008c,root));
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    if (comm.rank() == root)
        result.resize(total_size);
    gatherv(data, size, &result[0], recv_sizes, root, comm);
    return result;
}